

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_ARRAY::OAssign(_Type_ARRAY *this,Variable *obj1,Variable *obj2)

{
  Array *obj;
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable VStack_38;
  
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(pTVar3,(Type *)obj1);
  pOVar2 = Variable::operator->(in_RCX);
  if (bVar1) {
    obj = (Array *)pOVar2->data;
    pOVar2 = Variable::operator->(obj2);
    Array::operator=((Array *)pOVar2->data,obj);
  }
  else {
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(obj2);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(in_RCX);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&VStack_38,pTVar3,obj2);
    Variable::~Variable(&VStack_38);
  }
  Variable::Variable((Variable *)this,obj2);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_ARRAY::OAssign(Variable &obj1, const Variable &obj2) const {
    if (obj2->GetType() == *this) {
        obj1->GetData<Array>() = obj2->GetData<Array>();
    }
    else {
        obj2->GetType().AssignObject(*obj1);
        obj2->GetType().OAssign(obj1, obj2);
    }
    return Variable(obj1);
}